

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::Maybe<unsigned_int>::Maybe<unsigned_long_long>
          (Maybe<unsigned_int> *this,Maybe<unsigned_long_long> *other)

{
  Maybe<unsigned_long_long> *maybe;
  NullableValue<unsigned_long_long> *other_00;
  unsigned_long_long *puVar1;
  unsigned_long_long *val;
  undefined1 local_28 [8];
  NullableValue<unsigned_long_long> _val1451;
  Maybe<unsigned_long_long> *other_local;
  Maybe<unsigned_int> *this_local;
  
  _val1451.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long_long>_2)other;
  kj::_::NullableValue<unsigned_int>::NullableValue(&this->ptr);
  maybe = mv<kj::Maybe<unsigned_long_long>>((Maybe<unsigned_long_long> *)_val1451.field_1);
  other_00 = kj::_::readMaybe<unsigned_long_long>(maybe);
  kj::_::NullableValue<unsigned_long_long>::NullableValue
            ((NullableValue<unsigned_long_long> *)local_28,other_00);
  puVar1 = kj::_::NullableValue::operator_cast_to_unsigned_long_long_((NullableValue *)local_28);
  if (puVar1 != (unsigned_long_long *)0x0) {
    puVar1 = kj::_::NullableValue<unsigned_long_long>::operator*
                       ((NullableValue<unsigned_long_long> *)local_28);
    puVar1 = mv<unsigned_long_long>(puVar1);
    kj::_::NullableValue<unsigned_int>::emplace<unsigned_long_long>(&this->ptr,puVar1);
    kj::Maybe<unsigned_long_long>::operator=((Maybe<unsigned_long_long> *)_val1451.field_1.value);
  }
  kj::_::NullableValue<unsigned_long_long>::~NullableValue
            ((NullableValue<unsigned_long_long> *)local_28);
  return;
}

Assistant:

Maybe(Maybe<U>&& other) {
    KJ_IF_SOME(val, kj::mv(other)) {
      ptr.emplace(kj::mv(val));
      other = kj::none;
    }
  }